

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O3

FT_Error cff_parse_blend(CFF_Parser parser)

{
  FT_UInt vsindex;
  FT_UInt lenNDV;
  void *pvVar1;
  long lVar2;
  FT_Fixed *NDV;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  long lVar5;
  undefined1 *puVar6;
  FT_Bool FVar7;
  FT_Error FVar8;
  uint uVar9;
  FT_PtrDist offset;
  FT_Pointer pvVar10;
  FT_Long FVar11;
  ulong uVar12;
  uint uVar13;
  FT_Byte **ppFVar14;
  int iVar15;
  FT_Byte **ppFVar16;
  long lVar17;
  uint uVar18;
  FT_Error error;
  FT_Error local_5c;
  FT_Byte *local_58;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pvVar1 = parser->object;
  if (pvVar1 == (void *)0x0) {
    return 3;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x2d0);
  if (lVar2 == 0) {
    return 3;
  }
  vsindex = *(FT_UInt *)((long)pvVar1 + 0x2c8);
  lenNDV = *(FT_UInt *)(lVar2 + 0x450);
  NDV = *(FT_Fixed **)(lVar2 + 0x458);
  FVar7 = cff_blend_check_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV);
  if ((FVar7 != '\0') &&
     (FVar8 = cff_blend_build_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV), FVar8 != 0)) {
    return FVar8;
  }
  local_40 = cff_parse_num(parser,(FT_Byte **)parser->top[-1]);
  uVar18 = (uint)local_40;
  if (parser->stackSize < uVar18) {
    return 3;
  }
  local_5c = 0;
  uVar9 = *(int *)(lVar2 + 0x440) * uVar18;
  uVar13 = (uint)((ulong)((long)parser->top + (-8 - (long)parser->stack)) >> 3);
  local_48 = (ulong)(uVar13 - uVar9);
  FVar8 = 0xa1;
  if (uVar9 <= uVar13) {
    iVar15 = uVar18 * 5;
    uVar9 = *(uint *)(lVar2 + 0x470);
    uVar13 = *(uint *)(lVar2 + 0x474);
    if (uVar13 < uVar9 + iVar15) {
      pFVar3 = *(FT_Byte **)(lVar2 + 0x460);
      local_58 = *(FT_Byte **)(lVar2 + 0x468);
      pvVar10 = ft_mem_qrealloc(*(FT_Memory *)(*(long *)(lVar2 + 0x428) + 0x10),1,(ulong)uVar13,
                                (ulong)(uVar13 + iVar15),pFVar3,&local_5c);
      *(FT_Pointer *)(lVar2 + 0x460) = pvVar10;
      FVar8 = local_5c;
      if (local_5c != 0) goto LAB_002219f6;
      uVar9 = *(uint *)(lVar2 + 0x470);
      *(ulong *)(lVar2 + 0x468) = (ulong)uVar9 + (long)pvVar10;
      *(int *)(lVar2 + 0x474) = *(int *)(lVar2 + 0x474) + iVar15;
      if ((pFVar3 != (FT_Byte *)0x0) && ((long)pvVar10 - (long)pFVar3 != 0)) {
        ppFVar16 = parser->top;
        for (ppFVar14 = parser->stack; ppFVar14 < ppFVar16; ppFVar14 = ppFVar14 + 1) {
          pFVar4 = *ppFVar14;
          if ((pFVar3 <= pFVar4) && (pFVar4 < local_58)) {
            *ppFVar14 = pFVar4 + ((long)pvVar10 - (long)pFVar3);
            ppFVar16 = parser->top;
          }
        }
      }
    }
    *(uint *)(lVar2 + 0x470) = uVar9 + iVar15;
    local_4c = (int)local_48 + uVar18;
    if (uVar18 == 0) {
      FVar8 = 0;
    }
    else {
      local_40 = local_40 & 0xffffffff;
      local_58 = (FT_Byte *)0x0;
      uVar18 = local_4c;
      do {
        lVar5 = *(long *)(lVar2 + 0x448);
        local_38 = (ulong)(uint)((int)local_48 + (int)local_58);
        FVar11 = cff_parse_num(parser,(FT_Byte **)parser->stack[local_38]);
        iVar15 = (int)FVar11 << 0x10;
        if (1 < *(uint *)(lVar2 + 0x440)) {
          lVar17 = 1;
          do {
            uVar12 = (ulong)uVar18;
            uVar18 = uVar18 + 1;
            FVar11 = cff_parse_num(parser,(FT_Byte **)parser->stack[uVar12]);
            iVar15 = iVar15 + (int)FVar11 * *(int *)(lVar5 + lVar17 * 4);
            lVar17 = lVar17 + 1;
          } while ((uint)lVar17 < *(uint *)(lVar2 + 0x440));
        }
        pFVar3 = *(FT_Byte **)(lVar2 + 0x468);
        parser->stack[local_38] = pFVar3;
        *(FT_Byte **)(lVar2 + 0x468) = pFVar3 + 1;
        *pFVar3 = 0xff;
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar15 >> 0x18);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar15 >> 0x10);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)((uint)iVar15 >> 8);
        puVar6 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar6 + 1;
        *puVar6 = (char)iVar15;
        local_58 = (FT_Byte *)((long)local_58 + 1);
        FVar8 = local_5c;
      } while (local_58 != (FT_Byte *)local_40);
    }
    parser->top = parser->stack + local_4c;
  }
LAB_002219f6:
  *(undefined1 *)(lVar2 + 0x421) = 1;
  return FVar8;
}

Assistant:

static FT_Error
  cff_parse_blend( CFF_Parser  parser )
  {
    /* blend operator can only be used in a Private DICT */
    CFF_Private  priv = (CFF_Private)parser->object;
    CFF_SubFont  subFont;
    CFF_Blend    blend;
    FT_UInt      numBlends;
    FT_Error     error;


    if ( !priv || !priv->subfont )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    subFont = priv->subfont;
    blend   = &subFont->blend;

    if ( cff_blend_check_vector( blend,
                                 priv->vsindex,
                                 subFont->lenNDV,
                                 subFont->NDV ) )
    {
      error = cff_blend_build_vector( blend,
                                      priv->vsindex,
                                      subFont->lenNDV,
                                      subFont->NDV );
      if ( error )
        goto Exit;
    }

    numBlends = (FT_UInt)cff_parse_num( parser, parser->top - 1 );
    if ( numBlends > parser->stackSize )
    {
      FT_ERROR(( "cff_parse_blend: Invalid number of blends\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    FT_TRACE4(( "   %d value%s blended\n",
                numBlends,
                numBlends == 1 ? "" : "s" ));

    error = cff_blend_doBlend( subFont, parser, numBlends );

    blend->usedBV = TRUE;

  Exit:
    return error;
  }